

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 addFloatx80Sigs(floatx80 a,floatx80 b,flag zSign,float_status *status)

{
  undefined1 auVar1 [12];
  ulong uVar2;
  ulong uVar3;
  uint64_t zSig0;
  ulong uVar4;
  ulong uVar5;
  uint64_t zSig1;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  floatx80 fVar11;
  
  uVar4 = b.low;
  uVar5 = a._8_8_;
  uVar2 = a.low;
  uVar8 = a._8_4_ & 0x7fff;
  uVar9 = b._8_4_ & 0x7fff;
  iVar6 = uVar8 - uVar9;
  uVar3 = uVar2;
  if (iVar6 == 0 || uVar8 < uVar9) {
    if (iVar6 < 0) {
      if (uVar9 == 0x7fff) {
        if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
          uVar5 = (ulong)((uint)zSign << 0xf | 0x7fff);
          uVar2 = 0x8000000000000000;
          goto LAB_00d02c3d;
        }
        goto LAB_00d02abd;
      }
      iVar6 = iVar6 + (uint)(((undefined1  [16])a & (undefined1  [16])0x7fff) ==
                            (undefined1  [16])0x0);
      uVar8 = uVar9;
      if (iVar6 == 0) {
        zSig1 = 0;
      }
      else if (iVar6 < -0x3f) {
        if (iVar6 == -0x40) {
          uVar3 = 0;
          zSig1 = uVar2;
        }
        else {
          zSig1 = (uint64_t)(uVar2 != 0);
          uVar3 = 0;
        }
      }
      else {
        uVar3 = uVar2 >> (-(byte)iVar6 & 0x3f);
        zSig1 = uVar2 << ((byte)iVar6 & 0x3f);
      }
      goto LAB_00d02bef;
    }
    if (uVar8 == 0x7fff) {
      lVar7 = (uVar4 | uVar2) << 1;
      goto LAB_00d02ab4;
    }
    zSig0 = uVar4 + uVar2;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
      zSig1 = 0;
      goto LAB_00d02bfa;
    }
    if (zSig0 == 0) {
      uVar5 = (ulong)zSign << 0xf;
      uVar2 = 0;
      goto LAB_00d02c3d;
    }
    uVar3 = 0x3f;
    if (zSig0 != 0) {
      for (; zSig0 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    zSig0 = zSig0 << ((byte)(uVar3 ^ 0x3f) & 0x3f);
    uVar8 = 1 - (int)(uVar3 ^ 0x3f);
    zSig1 = 0;
LAB_00d02c27:
    fVar11 = roundAndPackFloatx80_tricore
                       (status->floatx80_rounding_precision,zSign,uVar8,zSig0,zSig1,status);
    auVar1 = fVar11._0_12_;
  }
  else {
    if (uVar8 != 0x7fff) {
      iVar6 = iVar6 - (uint)(((undefined1  [16])b & (undefined1  [16])0x7fff) ==
                            (undefined1  [16])0x0);
      if (iVar6 == 0) {
        zSig1 = 0;
      }
      else if (iVar6 < 0x40) {
        zSig1 = uVar4 << (-(byte)iVar6 & 0x3f);
        uVar4 = uVar4 >> ((byte)iVar6 & 0x3f);
      }
      else if (iVar6 == 0x40) {
        zSig1 = uVar4;
        uVar4 = 0;
      }
      else {
        bVar10 = uVar4 != 0;
        uVar4 = 0;
        zSig1 = (ulong)bVar10;
      }
LAB_00d02bef:
      zSig0 = uVar3 + uVar4;
      if (-1 < (long)zSig0) {
LAB_00d02bfa:
        zSig1 = (ulong)(zSig1 != 0) | zSig0 << 0x3f;
        zSig0 = (zSig0 >> 1) + 0x8000000000000000;
        uVar8 = uVar8 + 1;
      }
      goto LAB_00d02c27;
    }
    lVar7 = uVar2 * 2;
LAB_00d02ab4:
    if (lVar7 == 0) goto LAB_00d02c3d;
LAB_00d02abd:
    fVar11 = propagateFloatx80NaN_tricore(a,b,status);
    auVar1 = fVar11._0_12_;
  }
  uVar2 = auVar1._0_8_;
  uVar5 = (ulong)auVar1._8_4_;
LAB_00d02c3d:
  fVar11._8_8_ = uVar5 & 0xffffffff;
  fVar11.low = uVar2;
  return fVar11;
}

Assistant:

static floatx80 addFloatx80Sigs(floatx80 a, floatx80 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    int32_t expDiff;

    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    expDiff = aExp - bExp;
    if ( 0 < expDiff ) {
        if ( aExp == 0x7FFF ) {
            if ((uint64_t)(aSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            return a;
        }
        if ( bExp == 0 ) --expDiff;
        shift64ExtraRightJamming( bSig, 0, expDiff, &bSig, &zSig1 );
        zExp = aExp;
    }
    else if ( expDiff < 0 ) {
        if ( bExp == 0x7FFF ) {
            if ((uint64_t)(bSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            return packFloatx80(zSign,
                                floatx80_infinity_high,
                                floatx80_infinity_low);
        }
        if ( aExp == 0 ) ++expDiff;
        shift64ExtraRightJamming( aSig, 0, - expDiff, &aSig, &zSig1 );
        zExp = bExp;
    }
    else {
        if ( aExp == 0x7FFF ) {
            if ( (uint64_t) ( ( aSig | bSig )<<1 ) ) {
                return propagateFloatx80NaN(a, b, status);
            }
            return a;
        }
        zSig1 = 0;
        zSig0 = aSig + bSig;
        if ( aExp == 0 ) {
            if (zSig0 == 0) {
                return packFloatx80(zSign, 0, 0);
            }
            normalizeFloatx80Subnormal( zSig0, &zExp, &zSig0 );
            goto roundAndPack;
        }
        zExp = aExp;
        goto shiftRight1;
    }
    zSig0 = aSig + bSig;
    if ( (int64_t) zSig0 < 0 ) goto roundAndPack;
 shiftRight1:
    shift64ExtraRightJamming( zSig0, zSig1, 1, &zSig0, &zSig1 );
    zSig0 |= UINT64_C(0x8000000000000000);
    ++zExp;
 roundAndPack:
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}